

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

uint8_t matrix4_transformation_decompose_EXP
                  (matrix4 *self,vector3 *scale,quaternion *rotation,vector3 *translation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined4 in_EAX;
  uint uVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  (translation->field_0).v[0] = (self->field_0).m[3];
  (translation->field_0).v[1] = (self->field_0).m[7];
  (translation->field_0).v[2] = (self->field_0).m[0xb];
  uVar4 = *(undefined8 *)((long)&self->field_0 + 0x10);
  fVar12 = (float)*(undefined8 *)&self->field_0;
  fVar11 = (float)uVar4;
  uVar5 = *(undefined8 *)((long)&self->field_0 + 0x20);
  fVar13 = (float)uVar5;
  uVar6 = *(undefined8 *)((long)&self->field_0 + 0x30);
  iVar9 = -(uint)((float)uVar6 * fVar12 * fVar11 * fVar13 < 0.0);
  iVar10 = -(uint)((float)((ulong)uVar6 >> 0x20) *
                   (float)((ulong)*(undefined8 *)&self->field_0 >> 0x20) *
                   (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar5 >> 0x20) < 0.0);
  auVar7._4_4_ = iVar9;
  auVar7._0_4_ = iVar9;
  auVar7._8_4_ = iVar10;
  auVar7._12_4_ = iVar10;
  uVar8 = movmskpd(in_EAX,auVar7);
  fVar1 = (self->field_0).m[2];
  fVar2 = (self->field_0).m[6];
  fVar3 = (self->field_0).m[10];
  fVar12 = SQRT(fVar13 * fVar13 + fVar12 * fVar12 + fVar11 * fVar11);
  if ((uVar8 & 1) != 0) {
    fVar12 = -fVar12;
  }
  fVar11 = (self->field_0).m[0xe];
  (scale->field_0).v[0] = fVar12;
  fVar12 = SQRT((self->field_0).m[9] * (self->field_0).m[9] +
                (self->field_0).m[1] * (self->field_0).m[1] +
                (self->field_0).m[5] * (self->field_0).m[5]);
  if ((uVar8 & 2) != 0) {
    fVar12 = -fVar12;
  }
  (scale->field_0).v[1] = fVar12;
  fVar12 = SQRT((self->field_0).m[10] * (self->field_0).m[10] +
                (self->field_0).m[2] * (self->field_0).m[2] +
                (self->field_0).m[6] * (self->field_0).m[6]);
  uVar8 = -(uint)(fVar1 * fVar2 * fVar3 * fVar11 < 0.0);
  (scale->field_0).v[2] = (float)(uVar8 & (uint)-fVar12 | ~uVar8 & (uint)fVar12);
  *(undefined8 *)&rotation->field_0 = 0;
  *(undefined8 *)((long)&rotation->field_0 + 8) = 0x3f80000000000000;
  return '\x01';
}

Assistant:

HYPAPI uint8_t matrix4_transformation_decompose_EXP(struct matrix4 *self, struct vector3 *scale, struct quaternion *rotation, struct vector3 *translation)
{
	HYP_FLOAT signx, signy, signz;

	/* translation */
	translation->x = self->c30;
	translation->y = self->c31;
	translation->z = self->c32;

	/*
	 * self->c00 = scale->x;
	 * self->c11 = scale->y;
	 * self->c22 = scale->z;
	 */

	/* sign */
	signx = ((self->c00 * self->c01 * self->c02 * self->c03) < 0) ? -1.0f : 1.0f;
	signy = ((self->c10 * self->c11 * self->c12 * self->c13) < 0) ? -1.0f : 1.0f;
	signz = ((self->c20 * self->c21 * self->c22 * self->c23) < 0) ? -1.0f : 1.0f;

	/* scale */
	scale->x = signx * HYP_SQRT(self->c00 * self->c00 + self->c01 * self->c01 + self->c02 * self->c02);
	scale->y = signy * HYP_SQRT(self->c10 * self->c10 + self->c11 * self->c11 + self->c12 * self->c12);
	scale->z = signz * HYP_SQRT(self->c20 * self->c20 + self->c21 * self->c21 + self->c22 * self->c22);

	/* todo */
	quaternion_identity(rotation);

	return 1;
}